

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_load_unaligned(void *p)

{
  int c;
  long lVar1;
  c_v64 t;
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    t.u8[lVar1] = *(uint8_t *)((long)p + lVar1);
  }
  return (c_v64)t.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_load_unaligned(const void *p) {
  c_v64 t;
  uint8_t *pp = (uint8_t *)p;
  uint8_t *q = (uint8_t *)&t;
  int c;
  for (c = 0; c < 8; c++) q[c] = pp[c];
  return t;
}